

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseVolumeNonUefiData
          (FfsParser *this,UByteArray *data,UINT32 localOffset,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  USTATUS UVar2;
  UByteArray local_d0;
  CBString local_b0;
  CBString info;
  UByteArray local_80;
  CBString local_60;
  UModelIndex paddingIndex;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    usprintf(&info,"Full size: %Xh (%u)",(ulong)(uint)(data->d)._M_string_length);
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_b0,"Non-UEFI data");
    Bstrlib::CBString::CBString(&local_60);
    local_d0.d._M_dataplus._M_p = (pointer)&local_d0.d.field_2;
    local_d0.d._M_string_length = 0;
    local_d0.d.field_2._M_local_buf[0] = '\0';
    local_80.d._M_dataplus._M_p = (pointer)&local_80.d.field_2;
    local_80.d._M_string_length = 0;
    local_80.d.field_2._M_local_buf[0] = '\0';
    TreeModel::addItem(&paddingIndex,this_00,localOffset,'@','z',&local_b0,&local_60,&info,&local_d0
                       ,data,&local_80,Fixed,index,'\0');
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_d0);
    Bstrlib::CBString::~CBString(&local_60);
    Bstrlib::CBString::~CBString(&local_b0);
    usprintf((CBString *)&local_d0,"%s: non-UEFI data found in volume\'s free space",
             "parseVolumeNonUefiData");
    msg(this,(CBString *)&local_d0,&paddingIndex);
    Bstrlib::CBString::~CBString((CBString *)&local_d0);
    UVar2 = parseRawArea(this,&paddingIndex);
    Bstrlib::CBString::~CBString(&info);
  }
  else {
    UVar2 = 1;
  }
  return UVar2;
}

Assistant:

USTATUS FfsParser::parseVolumeNonUefiData(const UByteArray & data, const UINT32 localOffset, const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Get info
    UString info = usprintf("Full size: %Xh (%u)", (UINT32)data.size(), (UINT32)data.size());
    
    // Add padding tree item
    UModelIndex paddingIndex = model->addItem(localOffset, Types::Padding, Subtypes::DataPadding, UString("Non-UEFI data"), UString(), info, UByteArray(), data, UByteArray(), Fixed, index);
    msg(usprintf("%s: non-UEFI data found in volume's free space", __FUNCTION__), paddingIndex);
    
    // Parse contents as RAW area
    return parseRawArea(paddingIndex);
}